

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O2

size_t booster::locale::util::formatting_size_traits<char>::size(string *s,locale *l)

{
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  info *piVar5;
  size_t sVar6;
  size_t sVar7;
  
  bVar3 = std::has_facet<booster::locale::info>(l);
  if (bVar3) {
    piVar5 = std::use_facet<booster::locale::info>(l);
    iVar4 = (**(code **)(*(long *)piVar5 + 0x18))(piVar5);
    sVar6 = s->_M_string_length;
    if (iVar4 != 0) {
      sVar6 = 0;
      for (sVar7 = 0; s->_M_string_length != sVar7; sVar7 = sVar7 + 1) {
        bVar2 = (s->_M_dataplus)._M_p[sVar7];
        sVar1 = sVar6 + 1;
        if (0xbf < bVar2) {
          sVar6 = sVar1;
        }
        if (-1 < (char)bVar2) {
          sVar6 = sVar1;
        }
      }
    }
  }
  else {
    sVar6 = s->_M_string_length;
  }
  return sVar6;
}

Assistant:

static size_t size(std::string const &s,std::locale const &l)
    {
        if(!std::has_facet<info>(l))
            return s.size();
        if(!std::use_facet<info>(l).utf8())
            return s.size();
        // count code points, poor man's text size
        size_t res = 0;
        for(size_t i=0;i<s.size();i++) {
            unsigned char c = s[i];
            if(c <= 127)
                res ++;
            else if ((c & 0xC0) == 0xC0) { // first UTF-8 byte
                res ++;
            }
        }
        return res;
    }